

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::ShouldGenerateStringReplaceFastPath(Lowerer *this,Instr *callInstr,IntConstType argCount)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  OpndKind OVar6;
  undefined8 in_RAX;
  undefined4 *puVar7;
  Opnd *this_00;
  undefined8 uStack_38;
  
  this_00 = callInstr->m_src2;
  uStack_38 = in_RAX;
  if (argCount != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4fa9,"(argCount == 2)","argCount == 2");
    if (!bVar4) {
LAB_005e08b4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindSym) break;
    OVar6 = IR::Opnd::GetKind(this_00);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005e08b4;
      *puVar7 = 0;
    }
    pp_Var1 = this_00[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_005e08b4;
      *puVar7 = 0;
    }
    if (((ulong)pp_Var1[3] & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4faf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar4) goto LAB_005e08b4;
      *puVar7 = 0;
    }
    p_Var2 = pp_Var1[5];
    if (argCount < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4fb2,"(argCount >= 0)","argCount >= 0");
      if (!bVar4) goto LAB_005e08b4;
      *puVar7 = 0;
    }
    if ((argCount & 0xfffffffffffffffdU) == 0) {
      uStack_38 = CONCAT26(*(undefined2 *)(*(long *)(p_Var2 + 0x48) + 8),(undefined6)uStack_38);
      bVar4 = ValueType::IsLikelyString((ValueType *)((long)&uStack_38 + 6));
      if (bVar4) goto LAB_005e086f;
LAB_005e0888:
      bVar4 = false;
    }
    else {
LAB_005e086f:
      if (argCount == 1) {
        bVar4 = IR::Opnd::IsTaggedInt(*(Opnd **)(p_Var2 + 0x48));
        if (bVar4) {
          argCount = 1;
          goto LAB_005e0888;
        }
      }
      argCount = argCount - 1;
      this_00 = *(Opnd **)(p_Var2 + 0x50);
      bVar4 = true;
    }
  } while (bVar4);
  return OVar5 != OpndKindSym;
}

Assistant:

bool
Lowerer::ShouldGenerateStringReplaceFastPath(IR::Instr * callInstr, IntConstType argCount)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // argout sequence:
    // arg1(s12)<0>.var = ArgOut_A       s2.var, s11.var                         #0014   <---- a
    // arg2(s13)<4>.var = ArgOut_A       s3.var, arg1(s12)<0>.var                #0018   <---- b
    // arg3(s14)<8>.var = ArgOut_A       s4.var, arg2(s13)<4>.var                #001c   <---- c
    // s0[LikelyString].var = CallI      s5[ffunc].var, arg3(s14)<8>.var         #0020

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Assert(argCount == 2);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        // check to see if 'a' and 'c' are likely strings
        if((argCount == 2 || argCount == 0) && (!argInstr->GetSrc1()->GetValueType().IsLikelyString()))
        {
            return false;
        }
        // we want 'b' to be regex. Don't generate fastpath if it is a tagged int
        if((argCount == 1) && (argInstr->GetSrc1()->IsTaggedInt()))
        {
            return false;
        }
        argCount--;
        linkOpnd = argInstr->GetSrc2();
    }
    return true;
}